

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int *piVar2;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [16];
  Mat *pMVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  Mat *pMVar19;
  long lVar20;
  void *pvVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  ulong local_148;
  allocator_type local_131;
  void *local_130;
  Mat *local_128;
  int remain;
  long local_118;
  uint local_10c;
  long local_108;
  ulong local_100;
  long local_f8;
  void *local_f0;
  int remain_1;
  void *local_e0;
  ulong local_d8;
  void *local_d0;
  long local_c8;
  void *local_c0;
  long local_b8;
  int local_b0;
  int local_ac;
  Mat *local_a8;
  void *local_a0;
  Option *local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  void *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar13 = bottom_blob->c;
  if (iVar13 % this->group != 0) {
    return -100;
  }
  iVar29 = this->num_output;
  if (iVar29 % this->group != 0) {
    return -100;
  }
  local_118 = (long)bottom_blob->w;
  local_100 = (ulong)(uint)bottom_blob->h;
  uVar26 = bottom_blob->elemsize;
  iVar16 = (bottom_blob->w + -1) * this->stride_w;
  iVar24 = (this->kernel_w + -1) * this->dilation_w + iVar16 + 1;
  iVar25 = (this->kernel_h + -1) * this->dilation_h + (bottom_blob->h - 1U) * this->stride_h + 1;
  local_158 = (undefined1  [16])0x0;
  local_178._16_8_ = 0;
  local_178._24_8_ = (Allocator *)0x0;
  local_178._0_8_ = (void *)0x0;
  local_178._8_8_ = (int *)0x0;
  local_148 = 0;
  local_128 = bottom_blob;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    if ((Mat *)local_178 != top_blob) {
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_178._0_8_ = top_blob->data;
      local_178._8_8_ = top_blob->refcount;
      local_178._16_8_ = top_blob->elemsize;
      local_178._24_8_ = top_blob->allocator;
      local_158._0_4_ = top_blob->dims;
      local_158._4_4_ = top_blob->w;
      local_158._8_4_ = top_blob->h;
      local_158._12_4_ = top_blob->c;
      local_148 = top_blob->cstep;
    }
    iVar29 = this->num_output;
    pAVar3 = opt->blob_allocator;
    auVar30._0_4_ = -(uint)(local_158._0_4_ == 3);
    auVar30._4_4_ = -(uint)(iVar24 == local_158._4_4_);
    auVar30._8_4_ = -(uint)(iVar25 == local_158._8_4_);
    auVar30._12_4_ = -(uint)(iVar29 == local_158._12_4_);
    iVar16 = movmskps(iVar16,auVar30);
    if (((iVar16 != 0xf) || ((Allocator *)local_178._24_8_ != pAVar3)) ||
       (local_178._16_8_ != uVar26)) {
      if ((int *)local_178._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_178._8_8_ = *(int *)local_178._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_178._8_8_ == 0) {
          if ((Allocator *)local_178._24_8_ == (Allocator *)0x0) {
            if ((void *)local_178._0_8_ != (void *)0x0) {
              free(*(void **)(local_178._0_8_ - 8));
            }
          }
          else {
            (**(code **)(*(long *)local_178._24_8_ + 8))();
          }
        }
      }
      local_178._0_8_ = (void *)0x0;
      local_178._8_8_ = (int *)0x0;
      local_158._4_4_ = iVar24;
      local_158._0_4_ = 3;
      local_158._8_4_ = iVar25;
      local_158._12_4_ = iVar29;
      uVar11 = (long)(iVar25 * iVar24) * uVar26 + 0xf & 0xfffffffffffffff0;
      local_148 = uVar11 / uVar26;
      local_178._16_8_ = uVar26;
      local_178._24_8_ = pAVar3;
      if ((long)iVar29 * local_148 != 0) {
        uVar27 = (long)iVar29 * local_148 * uVar26 + 3 & 0xfffffffffffffffc;
        if (pAVar3 == (Allocator *)0x0) {
LAB_0012d778:
          local_178._8_8_ = (int *)0x0;
          local_178._0_8_ = (void *)0x0;
          local_178._16_8_ = uVar26;
          pvVar21 = malloc(uVar27 + 0x1c);
          local_178._0_8_ = (long)pvVar21 + 0x17U & 0xfffffffffffffff0;
          *(void **)(local_178._0_8_ - 8) = pvVar21;
        }
        else {
          local_178._0_8_ = (*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar27 + 4,uVar11 % uVar26);
        }
LAB_0012d79b:
        local_178._8_8_ = local_178._0_8_ + uVar27;
        *(undefined4 *)(local_178._0_8_ + uVar27) = 1;
      }
    }
  }
  else {
    pAVar3 = opt->workspace_allocator;
    auVar6._4_4_ = -(uint)(iVar25 == 0);
    auVar6._0_4_ = -(uint)(iVar24 == 0);
    auVar6._8_4_ = -(uint)(iVar29 == 0);
    auVar6._12_4_ = 0;
    iVar16 = movmskps(iVar16,auVar6 << 0x20);
    if ((iVar16 != 0xf) || ((pAVar3 != (Allocator *)0x0 || (uVar26 != 0)))) {
      local_178._0_8_ = (void *)0x0;
      local_178._8_8_ = (int *)0x0;
      local_158._4_4_ = iVar24;
      local_158._0_4_ = 3;
      local_158._8_4_ = iVar25;
      local_158._12_4_ = iVar29;
      uVar11 = (long)(iVar25 * iVar24) * uVar26 + 0xf & 0xfffffffffffffff0;
      local_148 = uVar11 / uVar26;
      local_178._16_8_ = uVar26;
      local_178._24_8_ = pAVar3;
      if ((long)iVar29 * local_148 != 0) {
        uVar27 = (long)iVar29 * local_148 * uVar26 + 3 & 0xfffffffffffffffc;
        if (pAVar3 == (Allocator *)0x0) goto LAB_0012d778;
        local_178._0_8_ = (*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar27 + 4,uVar11 % uVar26);
        goto LAB_0012d79b;
      }
    }
  }
  iVar29 = -100;
  if (((void *)local_178._0_8_ == (void *)0x0) || ((long)(int)local_158._12_4_ * local_148 == 0))
  goto LAB_0012e089;
  uVar26 = (long)this->kernel_h * (long)this->kernel_w;
  local_a8 = top_blob;
  local_98 = opt;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar26,&local_131);
  pMVar9 = local_a8;
  if (0 < this->kernel_h) {
    iVar29 = this->dilation_h;
    iVar16 = this->dilation_w;
    iVar25 = this->kernel_w;
    iVar10 = 0;
    iVar12 = 0;
    iVar17 = 0;
    do {
      if (0 < this->kernel_w) {
        lVar20 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar10 + lVar20] = iVar12;
          iVar12 = iVar12 + this->dilation_w;
          lVar20 = lVar20 + 1;
        } while ((int)lVar20 < this->kernel_w);
        iVar10 = iVar10 + (int)lVar20;
      }
      iVar12 = iVar12 + (iVar24 * iVar29 - iVar16 * iVar25);
      iVar17 = iVar17 + 1;
    } while (iVar17 < this->kernel_h);
  }
  auVar8 = _DAT_001394c0;
  auVar30 = _DAT_001394b0;
  auVar6 = _DAT_00139440;
  iVar29 = this->group;
  iVar16 = (int)uVar26;
  if (iVar29 == this->num_output && iVar13 == iVar29) {
    local_b8 = (long)this->group;
    if (0 < local_b8) {
      local_d0 = local_128->data;
      local_d8 = local_128->cstep * local_128->elemsize;
      pvVar21 = (this->weight_data).data;
      local_130 = (void *)(local_148 * local_178._16_8_);
      local_108 = CONCAT44(local_108._4_4_,local_158._4_4_);
      uVar22 = local_158._8_4_ * local_158._4_4_;
      _remain = (ulong)uVar22;
      iVar13 = this->bias_term;
      local_c0 = (void *)CONCAT44(local_c0._4_4_,iVar13);
      _remain_1 = (this->bias_data).data;
      local_128 = (Mat *)(ulong)(uVar22 + 3 & 0xfffffffc);
      lVar20 = _remain - 1;
      auVar28._8_4_ = (int)lVar20;
      auVar28._0_8_ = lVar20;
      auVar28._12_4_ = (int)((ulong)lVar20 >> 0x20);
      local_e0 = (void *)local_178._0_8_;
      lVar20 = local_178._0_8_ + 0xc;
      local_c8 = (long)iVar16 * 4;
      lVar14 = 0;
      auVar28 = auVar28 ^ _DAT_00139440;
      do {
        if (iVar13 == 0) {
          uVar31 = 0;
        }
        else {
          uVar31 = *(undefined4 *)((long)_remain_1 + lVar14 * 4);
        }
        if (0 < (int)uVar22) {
          pMVar19 = (Mat *)0x0;
          do {
            auVar32._8_4_ = (int)pMVar19;
            auVar32._0_8_ = pMVar19;
            auVar32._12_4_ = (int)((ulong)pMVar19 >> 0x20);
            auVar34 = (auVar32 | auVar8) ^ auVar6;
            iVar29 = auVar28._4_4_;
            if ((bool)(~(iVar29 < auVar34._4_4_ ||
                        auVar28._0_4_ < auVar34._0_4_ && auVar34._4_4_ == iVar29) & 1)) {
              *(undefined4 *)(lVar20 + -0xc + (long)pMVar19 * 4) = uVar31;
            }
            if (auVar34._12_4_ <= auVar28._12_4_ &&
                (auVar34._8_4_ <= auVar28._8_4_ || auVar34._12_4_ != auVar28._12_4_)) {
              *(undefined4 *)(lVar20 + -8 + (long)pMVar19 * 4) = uVar31;
            }
            auVar34 = (auVar32 | auVar30) ^ auVar6;
            iVar24 = auVar34._4_4_;
            if (iVar24 <= iVar29 && (iVar24 != iVar29 || auVar34._0_4_ <= auVar28._0_4_)) {
              *(undefined4 *)(lVar20 + -4 + (long)pMVar19 * 4) = uVar31;
              *(undefined4 *)(lVar20 + (long)pMVar19 * 4) = uVar31;
            }
            pMVar19 = (Mat *)((long)&pMVar19->data + 4);
          } while (local_128 != pMVar19);
        }
        if (0 < (int)local_100) {
          iVar29 = this->stride_h;
          iVar24 = this->stride_w;
          uVar11 = 0;
          do {
            if (0 < (int)local_118) {
              lVar18 = 0;
              do {
                if (0 < iVar16) {
                  lVar7 = lVar18 * iVar24 * 4 +
                          (long)(iVar29 * local_158._4_4_ * (int)uVar11) * 4 +
                          (long)local_130 * lVar14;
                  uVar27 = 0;
                  do {
                    *(float *)(local_178._0_8_ +
                              (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start[uVar27] * 4 + lVar7) =
                         *(float *)((long)pvVar21 + uVar27 * 4) *
                         *(float *)((long)local_d0 +
                                   lVar18 * 4 + uVar11 * local_118 * 4 + local_d8 * lVar14) +
                         *(float *)(local_178._0_8_ +
                                   (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar27] * 4 +
                                   lVar7);
                    uVar27 = uVar27 + 1;
                  } while ((uVar26 & 0xffffffff) != uVar27);
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != local_118);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != local_100);
        }
        lVar14 = lVar14 + 1;
        lVar20 = lVar20 + (long)local_130;
        pvVar21 = (void *)((long)pvVar21 + local_c8);
      } while (lVar14 != local_b8);
    }
  }
  else {
    uVar22 = iVar13 / iVar29;
    local_10c = this->num_output / iVar29;
    local_78 = (long)this->group;
    if (0 < local_78) {
      local_a0 = (this->weight_data).data;
      local_108 = local_148 * local_178._16_8_;
      local_b0 = local_158._4_4_;
      uVar23 = local_158._8_4_ * local_158._4_4_;
      _remain_1 = (void *)(ulong)uVar23;
      local_ac = this->bias_term;
      local_90 = (long)(int)local_10c;
      local_58 = (ulong)local_10c;
      local_60 = (ulong)(uVar23 + 3 & 0xfffffffc);
      lVar20 = (long)_remain_1 + -1;
      auVar34._8_4_ = (int)lVar20;
      auVar34._0_8_ = lVar20;
      auVar34._12_4_ = (int)((ulong)lVar20 >> 0x20);
      local_88 = local_108 * local_90;
      local_80 = (long)(int)(uVar22 * iVar16 * local_10c) * 4;
      local_50 = (long)(int)(uVar22 * iVar16) * 4;
      auVar34 = auVar34 ^ _DAT_00139440;
      local_70 = (void *)local_178._0_8_;
      local_f0 = (void *)(local_178._0_8_ + 0xc);
      local_f8 = 0;
      do {
        if (0 < (int)local_10c) {
          local_e0 = (void *)(local_f8 * local_90);
          local_68 = (this->bias_data).data;
          local_130 = local_a0;
          pvVar21 = local_f0;
          uVar11 = 0;
          do {
            local_d8 = uVar11;
            local_d0 = pvVar21;
            if (local_ac == 0) {
              uVar31 = 0;
            }
            else {
              uVar31 = *(undefined4 *)((long)local_68 + (local_d8 + (long)local_e0) * 4);
            }
            if (0 < (int)uVar23) {
              uVar11 = 0;
              do {
                auVar33._8_4_ = (int)uVar11;
                auVar33._0_8_ = uVar11;
                auVar33._12_4_ = (int)(uVar11 >> 0x20);
                auVar28 = (auVar33 | auVar8) ^ auVar6;
                iVar13 = auVar34._4_4_;
                if ((bool)(~(iVar13 < auVar28._4_4_ ||
                            auVar34._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar13) & 1)) {
                  *(undefined4 *)((long)local_d0 + uVar11 * 4 + -0xc) = uVar31;
                }
                if (auVar28._12_4_ <= auVar34._12_4_ &&
                    (auVar28._8_4_ <= auVar34._8_4_ || auVar28._12_4_ != auVar34._12_4_)) {
                  *(undefined4 *)((long)local_d0 + uVar11 * 4 + -8) = uVar31;
                }
                auVar33 = (auVar33 | auVar30) ^ auVar6;
                iVar29 = auVar33._4_4_;
                if (iVar29 <= iVar13 && (iVar29 != iVar13 || auVar33._0_4_ <= auVar34._0_4_)) {
                  *(undefined4 *)((long)local_d0 + uVar11 * 4 + -4) = uVar31;
                  *(undefined4 *)((long)local_d0 + uVar11 * 4) = uVar31;
                }
                uVar11 = uVar11 + 4;
              } while (local_60 != uVar11);
            }
            if (0 < (int)local_100) {
              local_c0 = (void *)((local_d8 + (long)local_e0) * local_108 + local_178._0_8_);
              iVar13 = this->stride_h * local_158._4_4_;
              local_c8 = CONCAT44(local_c8._4_4_,iVar13);
              local_b8 = (long)this->stride_w;
              _remain = 0;
              do {
                if (0 < (int)local_118) {
                  iVar29 = local_128->w;
                  sVar4 = local_128->cstep;
                  sVar5 = local_128->elemsize;
                  pvVar21 = local_128->data;
                  lVar20 = 0;
                  do {
                    if (0 < (int)uVar22) {
                      lVar14 = lVar20 * local_b8 * 4 + (long)(iVar13 * (int)_remain) * 4;
                      uVar11 = 0;
                      pvVar15 = local_130;
                      do {
                        if (0 < iVar16) {
                          fVar1 = *(float *)((long)pvVar21 +
                                            (uVar11 + uVar22 * (int)local_f8) * sVar4 * sVar5 +
                                            lVar20 * 4 + (long)iVar29 * _remain * 4);
                          uVar27 = 0;
                          do {
                            *(float *)((long)local_c0 +
                                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar27] * 4 +
                                      lVar14) =
                                 *(float *)((long)pvVar15 + uVar27 * 4) * fVar1 +
                                 *(float *)((long)local_c0 +
                                           (long)_space_ofs.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[uVar27] *
                                           4 + lVar14);
                            uVar27 = uVar27 + 1;
                          } while ((uVar26 & 0xffffffff) != uVar27);
                        }
                        uVar11 = uVar11 + 1;
                        pvVar15 = (void *)((long)pvVar15 + uVar26 * 4);
                      } while (uVar11 != uVar22);
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != local_118);
                }
                _remain = _remain + 1;
              } while (_remain != local_100);
            }
            local_130 = (void *)((long)local_130 + local_50);
            pvVar21 = (void *)((long)local_d0 + local_108);
            uVar11 = local_d8 + 1;
          } while (local_d8 + 1 != local_58);
        }
        local_f8 = local_f8 + 1;
        local_f0 = (void *)((long)local_f0 + local_88);
        local_a0 = (void *)((long)local_a0 + local_80);
      } while (local_f8 != local_78);
    }
  }
  iVar13 = this->pad_w;
  iVar29 = this->pad_h;
  if (iVar29 < 1 && iVar13 < 1) {
    Mat::operator=(local_a8,(Mat *)local_178);
LAB_0012e069:
    iVar29 = 0;
  }
  else {
    copy_cut_border((Mat *)local_178,local_a8,iVar29,iVar29,iVar13,iVar13,local_98->blob_allocator,
                    local_98->num_threads);
    iVar29 = -100;
    if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) goto LAB_0012e069;
  }
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0012e089:
  if ((int *)local_178._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_178._8_8_ = *(int *)local_178._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_178._8_8_ == 0) {
      if ((Allocator *)local_178._24_8_ == (Allocator *)0x0) {
        if ((void *)local_178._0_8_ != (void *)0x0) {
          free(*(void **)(local_178._0_8_ - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_178._24_8_ + 8))();
      }
    }
  }
  return iVar29;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}